

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_schnorrsig_sign_verify(void)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint32_t msglen;
  uchar msg_large [256];
  uchar xorbyte;
  size_t byte_idx;
  size_t sig_idx;
  secp256k1_scalar s;
  secp256k1_xonly_pubkey pk;
  secp256k1_keypair keypair;
  size_t i;
  uchar sig [3] [64];
  uchar msg [3] [32];
  uchar sk [32];
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  undefined4 in_stack_fffffffffffffcd0;
  uint32_t in_stack_fffffffffffffcd4;
  secp256k1_keypair *in_stack_fffffffffffffcd8;
  secp256k1_schnorrsig_extraparams *in_stack_fffffffffffffce0;
  secp256k1_keypair *in_stack_fffffffffffffce8;
  secp256k1_context *in_stack_fffffffffffffcf0;
  uchar *in_stack_fffffffffffffcf8;
  uchar *in_stack_fffffffffffffd00;
  secp256k1_context *in_stack_fffffffffffffd08;
  secp256k1_keypair *in_stack_fffffffffffffd20;
  int *in_stack_fffffffffffffd28;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffd30;
  secp256k1_context *in_stack_fffffffffffffd38;
  uchar *in_stack_fffffffffffffd48;
  secp256k1_keypair *in_stack_fffffffffffffd50;
  secp256k1_context *in_stack_fffffffffffffd58;
  ulong local_150;
  byte local_148 [32];
  byte abStack_128 [48];
  secp256k1_xonly_pubkey *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  uchar *in_stack_ffffffffffffff18;
  uchar *in_stack_ffffffffffffff20;
  secp256k1_context *in_stack_ffffffffffffff28;
  byte local_88 [136];
  
  testrand256((uchar *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  iVar3 = secp256k1_keypair_create
                    (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  if (iVar3 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x361,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk)");
    abort();
  }
  iVar3 = secp256k1_keypair_xonly_pub
                    (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                     in_stack_fffffffffffffd20);
  if (iVar3 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x362,"test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair)");
    abort();
  }
  for (local_150 = 0; local_150 < 3; local_150 = local_150 + 1) {
    testrand256((uchar *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    iVar3 = secp256k1_schnorrsig_sign32
                      (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8->data,
                       in_stack_fffffffffffffce0->magic,in_stack_fffffffffffffcd8,
                       (uchar *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    if (iVar3 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
              ,0x366,
              "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig[i], msg[i], &keypair, NULL)"
             );
      abort();
    }
    iVar3 = secp256k1_schnorrsig_verify
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                       ,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (iVar3 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
              ,0x367,
              "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[i], msg[i], sizeof(msg[i]), &pk)"
             );
      abort();
    }
  }
  uVar4 = testrand_int(in_stack_fffffffffffffcd4);
  uVar5 = (ulong)uVar4;
  uVar6 = testrand_bits(in_stack_fffffffffffffccc);
  uVar4 = testrand_int(in_stack_fffffffffffffcd4);
  bVar2 = (char)uVar4 + 1;
  lVar1 = uVar5 * 0x40 + -0x148;
  local_148[uVar6 + lVar1 + 0x148] = local_148[uVar6 + lVar1 + 0x148] ^ bVar2;
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x371,
            "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk)"
           );
    abort();
  }
  lVar1 = uVar5 * 0x40 + -0x148;
  local_148[uVar6 + lVar1 + 0x148] = local_148[uVar6 + lVar1 + 0x148] ^ bVar2;
  uVar6 = testrand_bits(in_stack_fffffffffffffccc);
  lVar1 = uVar5 * 0x40 + -0x148;
  abStack_128[uVar6 + 0x20 + lVar1 + 0x128] = abStack_128[uVar6 + 0x20 + lVar1 + 0x128] ^ bVar2;
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x376,
            "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk)"
           );
    abort();
  }
  lVar1 = uVar5 * 0x40 + -0x148;
  abStack_128[uVar6 + 0x20 + lVar1 + 0x128] = abStack_128[uVar6 + 0x20 + lVar1 + 0x128] ^ bVar2;
  uVar6 = testrand_bits(in_stack_fffffffffffffccc);
  lVar1 = uVar5 * 0x20 + -0x88;
  local_88[uVar6 + lVar1 + 0x88] = local_88[uVar6 + lVar1 + 0x88] ^ bVar2;
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x37b,
            "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk)"
           );
    abort();
  }
  lVar1 = uVar5 * 0x20 + -0x88;
  local_88[uVar6 + lVar1 + 0x88] = local_88[uVar6 + lVar1 + 0x88] ^ bVar2;
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x37f,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk)"
           );
    abort();
  }
  iVar3 = secp256k1_schnorrsig_sign32
                    (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8->data,
                     in_stack_fffffffffffffce0->magic,in_stack_fffffffffffffcd8,
                     (uchar *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  if (iVar3 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,899,
            "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig[0], msg[0], &keypair, NULL)"
           );
    abort();
  }
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,900,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk)"
           );
    abort();
  }
  memset(abStack_128,0xff,0x20);
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x386,
            "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk)"
           );
    abort();
  }
  iVar3 = secp256k1_schnorrsig_sign32
                    (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8->data,
                     in_stack_fffffffffffffce0->magic,in_stack_fffffffffffffcd8,
                     (uchar *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  if (iVar3 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x389,
            "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig[0], msg[0], &keypair, NULL)"
           );
    abort();
  }
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x38a,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk)"
           );
    abort();
  }
  secp256k1_scalar_set_b32
            ((secp256k1_scalar *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8->data,
             (int *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  secp256k1_scalar_negate
            ((secp256k1_scalar *)in_stack_fffffffffffffce0,
             (secp256k1_scalar *)in_stack_fffffffffffffcd8);
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x38e,
            "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk)"
           );
    abort();
  }
  iVar3 = secp256k1_schnorrsig_sign_custom
                    (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                     (size_t)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     in_stack_fffffffffffffce0);
  if (iVar3 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x391,
            "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig[0], NULL, 0, &keypair, NULL) == 1"
           );
    abort();
  }
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x392,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], NULL, 0, &pk) == 1");
    abort();
  }
  uVar4 = testrand_int(in_stack_fffffffffffffcd4);
  for (local_150 = 0; local_150 < 0x100; local_150 = local_150 + 0x20) {
    testrand256((uchar *)CONCAT44(uVar4,in_stack_fffffffffffffcd0));
  }
  iVar3 = secp256k1_schnorrsig_sign_custom
                    (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                     (size_t)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     in_stack_fffffffffffffce0);
  if (iVar3 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x39b,
            "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig[0], msg_large, msglen, &keypair, NULL) == 1"
           );
    abort();
  }
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x39c,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], msg_large, msglen, &pk) == 1"
           );
    abort();
  }
  iVar3 = secp256k1_schnorrsig_verify
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar3 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x39f,
            "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], msg_large, msglen, &pk) == 0"
           );
    abort();
  }
  return;
}

Assistant:

static void test_schnorrsig_sign_verify(void) {
    unsigned char sk[32];
    unsigned char msg[N_SIGS][32];
    unsigned char sig[N_SIGS][64];
    size_t i;
    secp256k1_keypair keypair;
    secp256k1_xonly_pubkey pk;
    secp256k1_scalar s;

    testrand256(sk);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk));
    CHECK(secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair));

    for (i = 0; i < N_SIGS; i++) {
        testrand256(msg[i]);
        CHECK(secp256k1_schnorrsig_sign32(CTX, sig[i], msg[i], &keypair, NULL));
        CHECK(secp256k1_schnorrsig_verify(CTX, sig[i], msg[i], sizeof(msg[i]), &pk));
    }

    {
        /* Flip a few bits in the signature and in the message and check that
         * verify and verify_batch (TODO) fail */
        size_t sig_idx = testrand_int(N_SIGS);
        size_t byte_idx = testrand_bits(5);
        unsigned char xorbyte = testrand_int(254)+1;
        sig[sig_idx][byte_idx] ^= xorbyte;
        CHECK(!secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk));
        sig[sig_idx][byte_idx] ^= xorbyte;

        byte_idx = testrand_bits(5);
        sig[sig_idx][32+byte_idx] ^= xorbyte;
        CHECK(!secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk));
        sig[sig_idx][32+byte_idx] ^= xorbyte;

        byte_idx = testrand_bits(5);
        msg[sig_idx][byte_idx] ^= xorbyte;
        CHECK(!secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk));
        msg[sig_idx][byte_idx] ^= xorbyte;

        /* Check that above bitflips have been reversed correctly */
        CHECK(secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk));
    }

    /* Test overflowing s */
    CHECK(secp256k1_schnorrsig_sign32(CTX, sig[0], msg[0], &keypair, NULL));
    CHECK(secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk));
    memset(&sig[0][32], 0xFF, 32);
    CHECK(!secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk));

    /* Test negative s */
    CHECK(secp256k1_schnorrsig_sign32(CTX, sig[0], msg[0], &keypair, NULL));
    CHECK(secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk));
    secp256k1_scalar_set_b32(&s, &sig[0][32], NULL);
    secp256k1_scalar_negate(&s, &s);
    secp256k1_scalar_get_b32(&sig[0][32], &s);
    CHECK(!secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk));

    /* The empty message can be signed & verified */
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig[0], NULL, 0, &keypair, NULL) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig[0], NULL, 0, &pk) == 1);

    {
        /* Test varying message lengths */
        unsigned char msg_large[32 * 8];
        uint32_t msglen  = testrand_int(sizeof(msg_large));
        for (i = 0; i < sizeof(msg_large); i += 32) {
            testrand256(&msg_large[i]);
        }
        CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig[0], msg_large, msglen, &keypair, NULL) == 1);
        CHECK(secp256k1_schnorrsig_verify(CTX, sig[0], msg_large, msglen, &pk) == 1);
        /* Verification for a random wrong message length fails */
        msglen = (msglen + (sizeof(msg_large) - 1)) % sizeof(msg_large);
        CHECK(secp256k1_schnorrsig_verify(CTX, sig[0], msg_large, msglen, &pk) == 0);
    }
}